

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_35bf99::PpuTest_pre_render_scanline_Test::~PpuTest_pre_render_scanline_Test
          (PpuTest_pre_render_scanline_Test *this)

{
  PpuTest::~PpuTest(&this->super_PpuTest);
  operator_delete(this,0x138);
  return;
}

Assistant:

TEST_F(PpuTest, pre_render_scanline) {
    registers.scanline = 261u; // Start at pre-render
    registers.odd_frame = expected.odd_frame = true;
    registers.mask = expected.mask =
            PpuMask(0b0000'1000); // Enable background rendering

    expected.cycle = 257;
    expected.scanline = 261u;
    // vram addr: yyy NN YYYYY XXXXX
    // Fine scroll should be increase once, and coarse x for each tile except
    // the last (31x).
    expected.vram_addr = PpuVram(0b001'00'00000'11111);
    expected.name_table = 0x1E;
    expected.name_table_latch = 0x1F;
    expected.pattern_table_shifter_hi = 0x8700;
    expected.pattern_table_latch_hi = 0x0F;
    expected.pattern_table_shifter_low = 0x8F00;
    expected.pattern_table_latch_low = 0x1F;
    expected.attribute_table_shifter_low = 0xFF80;
    expected.attribute_table_shifter_hi = 0x8000;
    expected.attribute_table_latch = 0x01;

    // Clear scrolling
    ppu->write_byte(0x2005, 0);
    ppu->write_byte(0x2005, 0);

    // Nametables
    for (int i = 0; i < 32; ++i) {
        EXPECT_CALL(mmu, read_byte(0x2000 + i)).WillOnce(Return(i));
    }

    // Attributes. Each address should be fetched four times since each byte
    // controlls 4x4 tiles.
    for (int i = 0; i < 8; ++i) {
        EXPECT_CALL(mmu, read_byte(0x23C0 + i))
                .Times(4)
                .WillRepeatedly(Return(i));
    }

    // Background
    for (int i = 0; i < 32; ++i) {
        EXPECT_CALL(mmu, read_byte(i * 16u)).WillOnce(Return(i));
        EXPECT_CALL(mmu, read_byte(i * 16u + 8u)).WillOnce(Return(i + 0xF0));
    }

    for (int i = 0; i <= 256; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_FALSE(pixel.has_value());
    }
    EXPECT_EQ(expected, registers);

    // During cycle 257 the horizontal bits should be reloaded.
    expected.vram_addr = PpuVram(0b001'00'00000'00000);
    expected.cycle = 258;

    EXPECT_FALSE(ppu->execute().has_value()); // Cycle 257
    EXPECT_EQ(expected, registers);

    // Cycle 258-320
    // During cycle 280-304 the vertical scroll bits should be reloaded.
    expected.vram_addr = PpuVram(0b000'00'00000'00000);
    expected.cycle = 321;

    for (int i = 258; i <= 320; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_FALSE(pixel.has_value());
    }
    EXPECT_EQ(expected, registers);

    // Cycle 321-336.
    // Fetch first two tiles for next scanline.
    expected.vram_addr = PpuVram(0b000'00'00000'00010);
    expected.cycle = 337;
    expected.name_table = 0x02;
    expected.name_table_latch = 0x03;
    expected.pattern_table_shifter_hi = 0xCC80;
    expected.pattern_table_latch_hi = 0x99;
    expected.pattern_table_shifter_low = 0xC000;
    expected.pattern_table_latch_low = 0x80;
    expected.attribute_table_shifter_low = 0xFF80;
    expected.attribute_table_shifter_hi = 0x7F80;
    expected.attribute_table_latch = 0x03;

    // Nametables
    EXPECT_CALL(mmu, read_byte(0x2000)).WillOnce(Return(0x02));
    EXPECT_CALL(mmu, read_byte(0x2001)).WillOnce(Return(0x03));

    // Attributes
    EXPECT_CALL(mmu, read_byte(0x23C0)).Times(2).WillRepeatedly(Return(0xAB));

    // Background
    EXPECT_CALL(mmu, read_byte(0x02 * 16u)).WillOnce(Return(0x80));
    EXPECT_CALL(mmu, read_byte(0x02 * 16u + 8u)).WillOnce(Return(0x99));
    EXPECT_CALL(mmu, read_byte(0x03 * 16u)).WillOnce(Return(0x80));
    EXPECT_CALL(mmu, read_byte(0x03 * 16u + 8u)).WillOnce(Return(0x99));

    for (int i = 321; i <= 336; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_FALSE(pixel.has_value());
    }
    EXPECT_EQ(expected, registers);

    // Finally cycle 337-340.
    // Two unused nametable fetches.
    expected.scanline = 0;
    expected.cycle = 0;
    expected.odd_frame = false;
    EXPECT_CALL(mmu, read_byte(0x2000 + 2)).Times(2).WillRepeatedly(Return(2));
    for (int i = 337; i <= 340; ++i) {
        const auto pixel = ppu->execute();
        EXPECT_FALSE(pixel.has_value());
    }
    EXPECT_EQ(expected, registers);
}